

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall
leveldb::DBTest_MinorCompactionsHappen_Test::TestBody(DBTest_MinorCompactionsHappen_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DB *pDVar4;
  size_type sVar5;
  int iVar6;
  int iVar7;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *p_Var8;
  undefined8 *puVar9;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var10;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_06;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_07;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_08;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_10;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_13;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_14;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_16;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_19;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  int level;
  int iVar12;
  uint uVar13;
  undefined8 uVar14;
  char *pcVar15;
  int result;
  leveldb *this_00;
  AssertionResult AVar16;
  int starting_num_tables;
  int ending_num_tables;
  Options options;
  undefined1 local_161;
  string local_160;
  string local_140;
  string local_120;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  int local_ec;
  string local_e8;
  int local_c8 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string local_b8;
  void *local_98;
  Options local_90;
  
  DBTest::CurrentOptions(&local_90,&this->super_DBTest);
  local_90.write_buffer_size = 10000;
  DBTest::Reopen(&this->super_DBTest,&local_90);
  iVar12 = 0;
  local_ec = 0;
  do {
    iVar6 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,iVar12);
    local_ec = local_ec + iVar6;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 7);
  paVar3 = &local_e8.field_2;
  uVar13 = 0;
  _Var10._M_head_impl = extraout_RDX;
  do {
    Key_abi_cxx11_(&local_160,(leveldb *)(ulong)uVar13,(int)_Var10._M_head_impl);
    Key_abi_cxx11_(&local_120,(leveldb *)(ulong)uVar13,i);
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct((ulong)&local_e8,-0x18);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar14 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_e8._M_string_length + local_120._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar3) {
        uVar14 = local_e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_e8._M_string_length + local_120._M_string_length) goto LAB_0011d70c;
      p_Var8 = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)std::__cxx11::string::replace
                            ((ulong)&local_e8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_0011d70c:
      p_Var8 = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                *)std::__cxx11::string::_M_append
                            ((char *)&local_120,(ulong)local_e8._M_dataplus._M_p);
    }
    _Var1._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 2);
    if (p_Var8->_M_head_impl == _Var1._M_head_impl) {
      local_140.field_2._M_allocated_capacity = *(undefined8 *)_Var1._M_head_impl;
      local_140.field_2._8_8_ = p_Var8[3]._M_head_impl;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *(undefined8 *)_Var1._M_head_impl;
      local_140._M_dataplus._M_p = (pointer)p_Var8->_M_head_impl;
    }
    local_140._M_string_length = (size_type)p_Var8[1]._M_head_impl;
    p_Var8->_M_head_impl = _Var1._M_head_impl;
    p_Var8[1]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    *_Var1._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x0;
    pDVar4 = (this->super_DBTest).db_;
    local_161 = 0;
    local_b8._M_dataplus._M_p._0_4_ = local_160._M_dataplus._M_p._0_4_;
    local_b8._M_dataplus._M_p._4_4_ = local_160._M_dataplus._M_p._4_4_;
    local_b8._M_string_length._0_4_ = (undefined4)local_160._M_string_length;
    local_b8._M_string_length._4_4_ = local_160._M_string_length._4_4_;
    local_100._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_140._M_dataplus._M_p;
    local_f8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_140._M_string_length;
    (*pDVar4->_vptr_DB[2])(&local_98,pDVar4,&local_161,&local_b8,&local_100);
    AVar16 = testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
             operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_c8,
                        (char *)&local_b8,(Status *)"Put(Key(i), Key(i) + std::string(1000, \'v\'))"
                       );
    _Var10._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar16.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_98 != (void *)0x0) {
      operator_delete__(local_98);
      _Var10 = extraout_RDX_00.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
      _Var10._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p);
      _Var10._M_head_impl = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
      _Var10._M_head_impl = extraout_RDX_03._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
      _Var10._M_head_impl = extraout_RDX_04;
    }
    pbVar11 = local_c0;
    if (local_c8[0]._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_160);
      if (local_c0 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_c0;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x410,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_160);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
      pbVar11 = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
        pbVar11 = local_c0;
      }
      goto LAB_0011de12;
    }
    if (local_c0 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      if (*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)local_c0 !=
          local_c0 + 0x10) {
        operator_delete(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **
                         )local_c0);
      }
      operator_delete(pbVar11);
      _Var10._M_head_impl = extraout_RDX_05;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 500);
  iVar12 = 0;
  iVar6 = 0;
  do {
    iVar7 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,iVar12);
    iVar6 = iVar6 + iVar7;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 7);
  local_c8[0] = iVar6;
  AVar16 = testing::internal::CmpHelperGT<int,int>
                     ((internal *)&local_160,"ending_num_tables","starting_num_tables",local_c8,
                      &local_ec);
  sVar5 = local_160._M_string_length;
  _Var10._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar16.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_140);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_160._M_string_length ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x413,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_160._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_140._M_dataplus._M_p + 8))();
      pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_160._M_string_length;
    }
LAB_0011de12:
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      if (*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)pbVar11 !=
          pbVar11 + 0x10) {
        operator_delete(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **
                         )pbVar11);
      }
      operator_delete(pbVar11);
    }
  }
  else {
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_160._M_string_length !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      if (*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
           local_160._M_string_length !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_160._M_string_length + 0x10)) {
        operator_delete(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **
                         )local_160._M_string_length);
      }
      operator_delete((void *)sVar5);
      _Var10 = extraout_RDX_06.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    }
    this_00 = (leveldb *)0x0;
    do {
      Key_abi_cxx11_(&local_140,this_00,(int)_Var10._M_head_impl);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_120,-0x18);
      uVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        uVar14 = local_140.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_140._M_string_length + local_120._M_string_length)) {
        uVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          uVar14 = local_120.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 <
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_140._M_string_length + local_120._M_string_length)) goto LAB_0011d965;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_120,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
      }
      else {
LAB_0011d965:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
      }
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar2 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_160.field_2._M_allocated_capacity = *psVar2;
        local_160.field_2._8_8_ = puVar9[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar2;
        local_160._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_160._M_string_length = puVar9[1];
      *puVar9 = psVar2;
      puVar9[1] = 0;
      *(undefined1 *)psVar2 = 0;
      Key_abi_cxx11_(&local_b8,this_00,(int)(puVar9 + 1));
      DBTest::Get(&local_e8,&this->super_DBTest,&local_b8,(Snapshot *)0x0);
      AVar16 = testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                         ((internal *)&local_100,"Key(i) + std::string(1000, \'v\')","Get(Key(i))",
                          &local_160,&local_e8);
      _Var10._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar16.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar3) {
        operator_delete(local_e8._M_dataplus._M_p);
        _Var10 = extraout_RDX_07.
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_) !=
          &local_b8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_));
        _Var10._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_08.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
        _Var10 = extraout_RDX_09.
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
        _Var10._M_head_impl = extraout_RDX_10;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
        _Var10._M_head_impl = extraout_RDX_11._M_head_impl;
      }
      pbVar11 = local_f8;
      if (local_100._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_160);
        if (local_f8 ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = "";
        }
        else {
          pcVar15 = *(char **)local_f8;
        }
        iVar12 = 0x416;
        goto LAB_0011dde2;
      }
      if (local_f8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        if (*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)local_f8 !=
            local_f8 + 0x10) {
          operator_delete(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            **)local_f8);
        }
        operator_delete(pbVar11);
        _Var10._M_head_impl = extraout_RDX_12;
      }
      uVar13 = (int)this_00 + 1;
      this_00 = (leveldb *)(ulong)uVar13;
    } while (uVar13 != 500);
    uVar13 = 0;
    DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
    _Var10._M_head_impl = extraout_RDX_13;
    do {
      Key_abi_cxx11_(&local_140,(leveldb *)(ulong)uVar13,(int)_Var10._M_head_impl);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_120,-0x18);
      uVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        uVar14 = local_140.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_140._M_string_length + local_120._M_string_length)) {
        uVar14 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          uVar14 = local_120.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 <
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_140._M_string_length + local_120._M_string_length)) goto LAB_0011db3f;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_120,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
      }
      else {
LAB_0011db3f:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
      }
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar2 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_160.field_2._M_allocated_capacity = *psVar2;
        local_160.field_2._8_8_ = puVar9[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar2;
        local_160._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_160._M_string_length = puVar9[1];
      *puVar9 = psVar2;
      puVar9[1] = 0;
      *(undefined1 *)psVar2 = 0;
      Key_abi_cxx11_(&local_b8,(leveldb *)(ulong)uVar13,(int)(puVar9 + 1));
      DBTest::Get(&local_e8,&this->super_DBTest,&local_b8,(Snapshot *)0x0);
      AVar16 = testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                         ((internal *)&local_100,"Key(i) + std::string(1000, \'v\')","Get(Key(i))",
                          &local_160,&local_e8);
      _Var10._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar16.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar3) {
        operator_delete(local_e8._M_dataplus._M_p);
        _Var10 = extraout_RDX_14.
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_) !=
          &local_b8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_));
        _Var10._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_15.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
        _Var10._M_head_impl = extraout_RDX_16;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
        _Var10._M_head_impl = extraout_RDX_17._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
        _Var10._M_head_impl = extraout_RDX_18;
      }
      pbVar11 = local_f8;
      if (local_100._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_160);
        if (local_f8 ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = "";
        }
        else {
          pcVar15 = *(char **)local_f8;
        }
        iVar12 = 0x41c;
LAB_0011dde2:
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,iVar12,pcVar15);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_160)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
        pbVar11 = local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
          pbVar11 = local_f8;
        }
        goto LAB_0011de12;
      }
      if (local_f8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        if (*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)local_f8 !=
            local_f8 + 0x10) {
          operator_delete(*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            **)local_f8);
        }
        operator_delete(pbVar11);
        _Var10._M_head_impl = extraout_RDX_19;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 500);
  }
  return;
}

Assistant:

TEST_F(DBTest, MinorCompactionsHappen) {
  Options options = CurrentOptions();
  options.write_buffer_size = 10000;
  Reopen(&options);

  const int N = 500;

  int starting_num_tables = TotalTableFiles();
  for (int i = 0; i < N; i++) {
    ASSERT_LEVELDB_OK(Put(Key(i), Key(i) + std::string(1000, 'v')));
  }
  int ending_num_tables = TotalTableFiles();
  ASSERT_GT(ending_num_tables, starting_num_tables);

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }

  Reopen();

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }
}